

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

int __thiscall Liby::Connection::init(Connection *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  element_type *peVar1;
  anon_class_8_1_8991fb9c local_a8;
  BasicHandler local_a0;
  anon_class_8_1_8991fb9c local_80;
  BasicHandler local_78;
  anon_class_8_1_8991fb9c local_48;
  BasicHandler local_40;
  enable_shared_from_this<Liby::Connection> local_20;
  Connection *local_10;
  Connection *this_local;
  
  local_10 = this;
  std::enable_shared_from_this<Liby::Connection>::shared_from_this(&local_20);
  std::shared_ptr<Liby::Connection>::operator=
            (&this->self_,(shared_ptr<Liby::Connection> *)&local_20);
  std::shared_ptr<Liby::Connection>::~shared_ptr((shared_ptr<Liby::Connection> *)&local_20);
  peVar1 = std::__shared_ptr_access<Liby::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->chan_);
  local_48.this = this;
  std::function<void()>::function<Liby::Connection::init()::__0,void>
            ((function<void()> *)&local_40,&local_48);
  Channel::onRead(peVar1,&local_40);
  std::function<void_()>::~function(&local_40);
  peVar1 = std::__shared_ptr_access<Liby::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->chan_);
  local_80.this = this;
  std::function<void()>::function<Liby::Connection::init()::__1,void>
            ((function<void()> *)&local_78,&local_80);
  Channel::onWrit(peVar1,&local_78);
  std::function<void_()>::~function(&local_78);
  peVar1 = std::__shared_ptr_access<Liby::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->chan_);
  local_a8.this = this;
  std::function<void()>::function<Liby::Connection::init()::__2,void>
            ((function<void()> *)&local_a0,&local_a8);
  Channel::onErro(peVar1,&local_a0);
  std::function<void_()>::~function(&local_a0);
  return extraout_EAX;
}

Assistant:

void Connection::init() {
    self_ = shared_from_this();
    chan_->onRead([this] { handleReadEvent(); });
    chan_->onWrit([this] { handleWritEvent(); });
    chan_->onErro([this] { handleErroEvent(); });
}